

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GIC.h
# Opt level: O2

void __thiscall
Gudhi::cover_complex::Cover_complex<std::vector<float,_std::allocator<float>_>_>::
compute_pairwise_distances<Gudhi::Euclidean_distance>
          (Cover_complex<std::vector<float,_std::allocator<float>_>_> *this)

{
  uint uVar1;
  pointer pvVar2;
  pointer pvVar3;
  ostream *poVar4;
  ulong uVar5;
  int i;
  int iVar6;
  long lVar7;
  int j;
  long lVar8;
  long lVar9;
  value_type vVar10;
  allocator_type local_5a;
  Euclidean_distance local_59;
  long local_58;
  long local_50;
  vector<double,_std::allocator<double>_> zeros;
  
  std::vector<double,_std::allocator<double>_>::vector(&zeros,(long)this->num_points,&local_5a);
  for (iVar6 = 0; uVar1 = this->num_points, iVar6 < (int)uVar1; iVar6 = iVar6 + 1) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(&this->distances,&zeros);
  }
  if (this->verbose != false) {
    poVar4 = std::operator<<((ostream *)&std::clog,"Computing distances...");
    std::endl<char,std::char_traits<char>>(poVar4);
    uVar1 = this->num_points;
  }
  uVar5 = (ulong)uVar1;
  local_58 = 0;
  lVar9 = 0;
  while (lVar9 < (int)uVar5) {
    local_50 = lVar9 + 1;
    uVar5 = (long)((int)local_50 * 100) / (long)(int)uVar5;
    iVar6 = (int)uVar5;
    lVar7 = local_58;
    lVar8 = lVar9;
    if ((this->verbose == true) &&
       ((int)((long)((ulong)(uint)(iVar6 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) % 10) == 0)) {
      poVar4 = std::operator<<((ostream *)&std::clog,"\r");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar6);
      std::operator<<(poVar4,"%");
      std::ostream::flush();
      lVar7 = local_58;
    }
    for (; uVar5 = (ulong)this->num_points, lVar8 < (long)uVar5; lVar8 = lVar8 + 1) {
      pvVar2 = (this->point_cloud).
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      vVar10 = Euclidean_distance::operator()
                         (&local_59,pvVar2 + lVar9,
                          (vector<float,_std::allocator<float>_> *)
                          ((long)&(pvVar2->super__Vector_base<float,_std::allocator<float>_>).
                                  _M_impl.super__Vector_impl_data + lVar7));
      pvVar3 = (this->distances).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(double *)
       (*(long *)&pvVar3[lVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data + lVar8 * 8) = (double)vVar10;
      *(double *)
       (*(long *)((long)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar7) + lVar9 * 8) = (double)vVar10;
      lVar7 = lVar7 + 0x18;
    }
    local_58 = local_58 + 0x18;
    lVar9 = local_50;
  }
  if (this->verbose != false) {
    std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&zeros.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void compute_pairwise_distances(Distance ref_distance) {
    std::vector<double> zeros(this->num_points);
    for (int i = 0; i < this->num_points; i++) distances.push_back(zeros);
    if (verbose) std::clog << "Computing distances..." << std::endl;
    for (int i = 0; i < this->num_points; i++) {
      int state = 100 * (i + 1) / this->num_points;
      if (verbose && state % 10 == 0) std::clog << "\r" << state << "%" << std::flush;
      for (int j = i; j < this->num_points; j++) {
        double dis = ref_distance(point_cloud[i], point_cloud[j]);
        distances[i][j] = dis;
        distances[j][i] = dis;
      }
    }
    if (verbose) std::clog << std::endl;
  }